

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
::clear(Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
        *this,ID_index rowIndex)

{
  iterator it;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *entry;
  
  entry = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
           *)operator_new(4);
  entry->rowIndex_ = rowIndex;
  it._M_node = (_Base_ptr)
               std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
               ::find((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
                       *)this,&entry);
  if ((_Rb_tree_header *)it._M_node != &(this->column_)._M_t._M_impl.super__Rb_tree_header) {
    _delete_entry(this,&it);
  }
  operator_delete(entry,4);
  return;
}

Assistant:

inline void Set_column<Master_matrix>::clear(ID_index rowIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  auto entry = entryPool_->construct(rowIndex);
  auto it = column_.find(entry);
  if (it != column_.end()) {
    _delete_entry(it);
  }
  entryPool_->destroy(entry);
}